

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O3

void do_call(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA **ppCVar1;
  short sVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  CClass *pCVar8;
  CHAR_DATA *pCVar9;
  undefined4 uVar10;
  char *pcVar11;
  ulong uVar12;
  string_view fmt;
  int sn;
  int where;
  char arg2 [4608];
  char arg1 [4608];
  char buf [4608];
  CHAR_DATA *local_3660;
  uint local_3654;
  ulong local_3650;
  CHAR_DATA *local_3648;
  CHAR_DATA local_363c [5];
  char local_2438 [4608];
  char local_1238 [4616];
  
  bVar4 = is_npc(ch);
  if ((bVar4) && (ch->desc == (DESCRIPTOR_DATA *)0x0)) {
    return;
  }
  target_name = one_argument(argument,local_2438);
  one_argument(target_name,(char *)((long)&local_363c[0].next + 4));
  if (local_2438[0] == '\0') {
    pcVar11 = "Call which what where?\n\r";
    goto LAB_002d4a6e;
  }
  uVar5 = find_spell(ch,local_2438);
  local_3654 = uVar5;
  if (((((int)uVar5 < 1) || (uVar12 = (ulong)uVar5, skill_table[uVar12].spell_fun == spell_null)) ||
      ((bVar4 = is_npc(ch), !bVar4 && (iVar6 = get_skill(ch,uVar5), iVar6 < 5)))) ||
     ((bVar4 = is_npc(ch), !bVar4 && (ch->pcdata->learned[uVar12] == 0)))) {
    pcVar11 = "You don\'t know any powers of that name.\n\r";
    goto LAB_002d4a6e;
  }
  if ((ch->position < skill_table[uVar12].minimum_position) && (iVar6 = get_trust(ch), iVar6 < 0x3b)
     ) {
    pcVar11 = "You can\'t concentrate enough.\n\r";
    goto LAB_002d4a6e;
  }
  if ((skill_table[uVar12].ctype != 3) && (bVar4 = is_immortal(ch), !bVar4)) {
    pcVar11 = "You can\'t call that.\n\r";
    goto LAB_002d4a6e;
  }
  bVar4 = cabal_down(ch,(int)ch->cabal);
  if (bVar4) {
    return;
  }
  sVar2 = ch->level;
  pCVar8 = ch->my_class;
  if ((pCVar8 == (CClass *)0x0) &&
     ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
      (pCVar8 = ch->pIndexData->my_class, pCVar8 == (CClass *)0x0)))) {
    pCVar8 = CClass::GetClass(0);
  }
  iVar6 = CClass::GetIndex(pCVar8);
  local_3650 = CONCAT44(local_3650._4_4_,0x32);
  if (sVar2 + 2 != (int)*(short *)(uVar12 * 0x60 + 0x44e788 + (long)iVar6 * 2)) {
    sVar2 = skill_table[uVar12].min_mana;
    local_3650 = (ulong)(uint)(int)ch->level;
    pCVar8 = char_data::Class(ch);
    iVar6 = CClass::GetIndex(pCVar8);
    iVar7 = (int)(100 / (long)(((int)local_3650 -
                               (int)*(short *)(uVar12 * 0x60 + 0x44e788 + (long)iVar6 * 2)) + 2));
    iVar6 = (int)sVar2;
    if (sVar2 < iVar7) {
      iVar6 = iVar7;
    }
    local_3650 = CONCAT44(local_3650._4_4_,iVar6);
  }
  pCVar9 = ch;
  switch(skill_table[uVar12].target) {
  case 0:
    bVar3 = 1;
    pCVar9 = (CHAR_DATA *)0x0;
    uVar10 = 3;
    goto LAB_002d4e7a;
  case 1:
  case 9:
    if (local_363c[0].next._4_1_ == '\0') {
      pCVar9 = ch->fighting;
      if (pCVar9 == (CHAR_DATA *)0x0) {
        pcVar11 = "Call the power on whom?\n\r";
        goto LAB_002d4a6e;
      }
    }
    else {
      pCVar9 = get_char_room(ch,target_name);
      if (pCVar9 == (CHAR_DATA *)0x0) {
LAB_002d4da4:
        pcVar11 = "They aren\'t here.\n\r";
        goto LAB_002d4a6e;
      }
    }
    bVar4 = is_affected_by(ch,0x12);
    if (bVar4) {
      bVar3 = 0;
      uVar10 = 0;
      local_3660 = pCVar9;
      if (ch->master == pCVar9) {
        pcVar11 = "You can\'t do that on your own master.\n\r";
        goto LAB_002d4a6e;
      }
    }
    else {
LAB_002d4e3b:
      bVar3 = 0;
      uVar10 = 0;
      local_3660 = pCVar9;
    }
    break;
  case 2:
    if (local_363c[0].next._4_1_ != '\0') {
      pCVar9 = get_char_room(ch,target_name);
      if (pCVar9 == (CHAR_DATA *)0x0) goto LAB_002d4da4;
      goto LAB_002d4e3b;
    }
    bVar3 = 0;
    uVar10 = 0;
    local_3660 = ch;
    break;
  case 3:
    if ((local_363c[0].next._4_1_ != '\0') && (bVar4 = is_name(target_name,ch->name), !bVar4)) {
      pcVar11 = "You cannot call this power on another.\n\r";
      goto LAB_002d4a6e;
    }
LAB_002d4c99:
    bVar3 = 0;
    uVar10 = 0;
    goto LAB_002d4e7a;
  case 4:
    if (local_363c[0].next._4_1_ == '\0') {
      pcVar11 = "What should the power be called upon?\n\r";
      goto LAB_002d4a6e;
    }
    pCVar9 = (CHAR_DATA *)get_obj_carry(ch,target_name,ch);
    if (pCVar9 == (CHAR_DATA *)0x0) {
      pcVar11 = "You are not carrying that.\n\r";
      goto LAB_002d4a6e;
    }
LAB_002d4e72:
    bVar3 = 1;
    uVar10 = 1;
LAB_002d4e7a:
    local_3660 = (CHAR_DATA *)0x0;
    break;
  case 5:
    if (local_363c[0].next._4_1_ == '\0') goto LAB_002d4c99;
    pCVar9 = get_char_room(ch,target_name);
    if (pCVar9 == (CHAR_DATA *)0x0) {
      pCVar9 = (CHAR_DATA *)get_obj_carry(ch,target_name,ch);
LAB_002d4e69:
      if (pCVar9 == (CHAR_DATA *)0x0) {
        pcVar11 = "You don\'t see that here.\n\r";
        goto LAB_002d4a6e;
      }
      goto LAB_002d4e72;
    }
    bVar3 = 0;
    uVar10 = 0;
    local_3660 = pCVar9;
    break;
  case 6:
    if (local_363c[0].next._4_1_ == '\0') {
      local_3648 = ch->fighting;
      if (local_3648 == (CHAR_DATA *)0x0) {
        pcVar11 = "Call the power on who or what?\n\r";
        goto LAB_002d4a6e;
      }
    }
    else {
      local_3648 = get_char_room(ch,target_name);
      if (local_3648 == (CHAR_DATA *)0x0) {
        pCVar9 = (CHAR_DATA *)get_obj_here(ch,target_name);
        goto LAB_002d4e69;
      }
    }
    bVar4 = is_affected_by(ch,0x12);
    pCVar9 = local_3648;
    if (!bVar4) goto LAB_002d4e3b;
    bVar3 = 0;
    uVar10 = 0;
    local_3660 = local_3648;
    if (ch->master == local_3648) {
      pcVar11 = "You can\'t do that on your own follower.\n\r";
      goto LAB_002d4a6e;
    }
    break;
  case 7:
    bVar3 = 1;
    local_363c[0].next._0_4_ = direction_lookup(target_name);
    if (((int)local_363c[0].next < 0) ||
       (ch->in_room->exit[(int)local_363c[0].next] == (EXIT_DATA *)0x0)) {
      pcVar11 = "That\'s not a valid direction.\n\r";
      goto LAB_002d4a6e;
    }
    local_3660 = (CHAR_DATA *)0x0;
    uVar10 = 5;
    pCVar9 = local_363c;
    break;
  default:
    fmt._M_str = "Do_cast: bad target for sn {}.";
    fmt._M_len = 0x1e;
    CLogger::Warn<int&>((CLogger *)&RS.field_0x140,fmt,(int *)&local_3654);
    return;
  }
  local_3648 = (CHAR_DATA *)CONCAT44(local_3648._4_4_,uVar10);
  bVar4 = is_npc(ch);
  if ((!bVar4) && ((int)ch->mana < (int)(uint)local_3650)) {
    pcVar11 = "You don\'t have enough mana.\n\r";
LAB_002d4a6e:
    send_to_char(pcVar11,ch);
    return;
  }
  WAIT_STATE(ch,(int)skill_table[uVar12].beats);
  bVar4 = is_npc(ch);
  if (!bVar4) {
    iVar6 = number_percent();
    iVar7 = get_skill(ch,uVar5);
    if (iVar7 < iVar6) {
      send_to_char("You lost your concentration.\n\r",ch);
      if (uVar5 != (int)gsn_rage) {
        check_improve(ch,uVar5,false,1);
      }
      ch->mana = ch->mana -
                 (short)((uint)(int)(short)((short)(((uint)local_3650 & 0xffff) >> 0xf) +
                                           (short)local_3650) >> 1);
      goto LAB_002d505b;
    }
  }
  ch->mana = ch->mana - (short)local_3650;
  if (skill_table[uVar12].target == 1) {
    bVar4 = is_safe(ch,local_3660);
    if (bVar4) {
      return;
    }
    if ((((skill_table[(int)local_3654].target == 1) && (bVar4 = is_npc(ch), !bVar4)) &&
        (bVar4 = is_npc(local_3660), !bVar4)) &&
       ((ch->fighting == (CHAR_DATA *)0x0 || (local_3660->fighting == (CHAR_DATA *)0x0)))) {
      uVar5 = number_range(0,2);
      if (uVar5 < 3) {
        iVar6 = *(int *)(&DAT_003ad350 + (ulong)uVar5 * 4);
        pcVar11 = pers(ch,local_3660);
        sprintf(local_1238,&DAT_003ad350 + iVar6,pcVar11);
      }
      if ((local_3660 != ch) && (bVar4 = is_npc(ch), !bVar4)) {
        do_myell(local_3660,local_1238,ch);
      }
    }
  }
  (*skill_table[(int)local_3654].spell_fun)(local_3654,(int)ch->level,ch,pCVar9,(int)local_3648);
  uVar5 = local_3654;
  check_improve(ch,local_3654,true,1);
  uVar12 = (ulong)(int)uVar5;
LAB_002d505b:
  if (local_3660 == ch) {
    return;
  }
  if ((bool)(skill_table[uVar12].target != 1 & (bVar3 | skill_table[uVar12].target != 6))) {
    return;
  }
  if (local_3660->master == ch) {
    return;
  }
  un_blade_barrier(ch,(char *)0x0);
  pCVar9 = ch->in_room->people;
  do {
    if (pCVar9 == (CHAR_DATA *)0x0) {
      return;
    }
    ppCVar1 = &pCVar9->next_in_room;
    bVar4 = local_3660 != pCVar9;
    pCVar9 = *ppCVar1;
  } while ((bVar4) || (local_3660->fighting != (CHAR_DATA *)0x0));
  multi_hit(local_3660,ch,-1);
  return;
}

Assistant:

void do_call(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	EXIT_DATA *pexit;
	void *vo;
	int mana, where;
	int sn;
	int target;

	if (is_npc(ch) && ch->desc == nullptr)
		return;

	target_name = one_argument(argument, arg1);

	one_argument(target_name, arg2);

	if (arg1[0] == '\0')
	{
		send_to_char("Call which what where?\n\r", ch);
		return;
	}

	sn = find_spell(ch, arg1);

	if (sn < 1
		|| skill_table[sn].spell_fun == spell_null
		|| (!is_npc(ch) && get_skill(ch, sn) < 5)
		|| (!is_npc(ch) && ch->pcdata->learned[sn] == 0))
	{
		send_to_char("You don't know any powers of that name.\n\r", ch);
		return;
	}

	if (ch->position < skill_table[sn].minimum_position && get_trust(ch) < MAX_LEVEL - 1)
	{
		send_to_char("You can't concentrate enough.\n\r", ch);
		return;
	}

	if (skill_table[sn].ctype != CMD_POWER && !is_immortal(ch))
	{
		send_to_char("You can't call that.\n\r", ch);
		return;
	}

	if (cabal_down(ch, ch->cabal))
		return;

	if (ch->level + 2 == skill_table[sn].skill_level[ch->Class()->GetIndex()])
		mana = 50;
	else
		mana = std::max((int)skill_table[sn].min_mana, 100 / (2 + ch->level - skill_table[sn].skill_level[ch->Class()->GetIndex()]));

	/*
	 * Locate targets.
	 */
	victim = nullptr;
	obj = nullptr;
	vo = nullptr;
	target = TARGET_NONE;

	switch (skill_table[sn].target)
	{
		case TAR_IGNORE:
			break;
		case TAR_CHAR_GENERAL:
		case TAR_CHAR_OFFENSIVE:
			if (arg2[0] == '\0')
			{
				victim = ch->fighting;

				if (victim == nullptr)
				{
					send_to_char("Call the power on whom?\n\r", ch);
					return;
				}
			}
			else
			{
				victim = get_char_room(ch, target_name);

				if (victim == nullptr)
				{
					send_to_char("They aren't here.\n\r", ch);
					return;
				}
			}

			if (is_affected_by(ch, AFF_CHARM) && ch->master == victim)
			{
				send_to_char("You can't do that on your own master.\n\r", ch);
				return;
			}

			vo = (void *)victim;
			target = TARGET_CHAR;
			break;
		case TAR_CHAR_DEFENSIVE:
			if (arg2[0] == '\0')
				victim = ch;
			else
			{
				victim = get_char_room(ch, target_name);

				if (victim == nullptr)
				{
					send_to_char("They aren't here.\n\r", ch);
					return;
				}
			}

			vo = (void *)victim;
			target = TARGET_CHAR;
			break;
		case TAR_CHAR_SELF:
			if (arg2[0] != '\0' && !is_name(target_name, ch->name))
			{
				send_to_char("You cannot call this power on another.\n\r", ch);
				return;
			}

			vo = (void *)ch;
			target = TARGET_CHAR;
			break;
		case TAR_OBJ_INV:
			if (arg2[0] == '\0')
			{
				send_to_char("What should the power be called upon?\n\r", ch);
				return;
			}

			obj = get_obj_carry(ch, target_name, ch);

			if (obj == nullptr)
			{
				send_to_char("You are not carrying that.\n\r", ch);
				return;
			}

			vo = (void *)obj;
			target = TARGET_OBJ;
			break;
		case TAR_OBJ_CHAR_OFF:
			if (arg2[0] == '\0')
			{
				victim = ch->fighting;

				if (victim == nullptr)
				{
					send_to_char("Call the power on who or what?\n\r", ch);
					return;
				}

				target = TARGET_CHAR;
			}
			else
			{
				victim = get_char_room(ch, target_name);

				if (victim != nullptr)
					target = TARGET_CHAR;
			}

			if (target == TARGET_CHAR) /* check the sanity of the attack */
			{
				if (is_affected_by(ch, AFF_CHARM) && ch->master == victim)
				{
					send_to_char("You can't do that on your own follower.\n\r", ch);
					return;
				}

				vo = (void *)victim;
			}
			else if ((obj = get_obj_here(ch, target_name)) != nullptr)
			{
				vo = (void *)obj;
				target = TARGET_OBJ;
			}
			else
			{
				send_to_char("You don't see that here.\n\r", ch);
				return;
			}

			break;
		case TAR_OBJ_CHAR_DEF:
			if (arg2[0] == '\0')
			{
				vo = (void *)ch;
				target = TARGET_CHAR;
			}
			else if ((victim = get_char_room(ch, target_name)) != nullptr)
			{
				vo = (void *)victim;
				target = TARGET_CHAR;
			}
			else if ((obj = get_obj_carry(ch, target_name, ch)) != nullptr)
			{
				vo = (void *)obj;
				target = TARGET_OBJ;
			}
			else
			{
				send_to_char("You don't see that here.\n\r", ch);
				return;
			}

			break;
		case TAR_DIR:
			where = direction_lookup(target_name);
			pexit = ch->in_room->exit[where];

			if (where < 0 || !pexit)
			{
				send_to_char("That's not a valid direction.\n\r", ch);
				return;
			}

			vo = &where;
			target = TARGET_DIR;
			break;
		default:
			RS.Logger.Warn("Do_cast: bad target for sn {}.", sn);
			return;
	}

	if (!is_npc(ch) && ch->mana < mana)
	{
		send_to_char("You don't have enough mana.\n\r", ch);
		return;
	}

	WAIT_STATE(ch, skill_table[sn].beats);

	if (!is_npc(ch) && (number_percent() > get_skill(ch, sn)))
	{
		send_to_char("You lost your concentration.\n\r", ch);

		if (sn != gsn_rage)
			check_improve(ch, sn, false, 1);

		ch->mana -= mana / 2;
	}
	else
	{
		ch->mana -= mana;

		if (skill_table[sn].target == TAR_CHAR_OFFENSIVE && is_safe(ch, victim))
			return;

		if (skill_table[sn].target == TAR_CHAR_OFFENSIVE)
		{
			if (!is_npc(ch) && !is_npc(victim) && (ch->fighting == nullptr || victim->fighting == nullptr))
			{
				switch (number_range(0, 2))
				{
					case 0:
					case 1:
						sprintf(buf, "Die, %s you sorcerous dog!", pers(ch, victim));
						break;
					case 2:
						sprintf(buf, "Help! %s is casting a spell on me!", pers(ch, victim));
						break;
				}

				if (victim != ch && !is_npc(ch))
					do_myell(victim, buf, ch);
			}

			if (check_volley(ch, victim))
			{
				act("$N reflects your spell right back at you!", ch, 0, victim, TO_CHAR);
				act("You reflect $n's spell right back at $m!", ch, 0, victim, TO_VICT);
				act("$N reflects $n's spell right back at $m!", ch, 0, victim, TO_NOTVICT);
				(*skill_table[sn].spell_fun)(sn, ch->level * 2, victim, ch, target);
				return;
			}
		}

		(*skill_table[sn].spell_fun)(sn, ch->level, ch, vo, target);
		check_improve(ch, sn, true, 1);
	}

	if ((skill_table[sn].target == TAR_CHAR_OFFENSIVE
			|| (skill_table[sn].target == TAR_OBJ_CHAR_OFF && target == TARGET_CHAR))
		&& victim != ch
		&& victim->master != ch)
	{
		CHAR_DATA *vch;
		CHAR_DATA *vch_next;
		un_blade_barrier(ch, nullptr);

		for (vch = ch->in_room->people; vch; vch = vch_next)
		{
			vch_next = vch->next_in_room;

			if (victim == vch && victim->fighting == nullptr)
			{
				multi_hit(victim, ch, TYPE_UNDEFINED);
				break;
			}
		}
	}
}